

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O0

void __thiscall DnsStats::RegisterEdnsUsage(DnsStats *this,uint32_t flags,uint32_t *e_rcode)

{
  int local_24;
  int i;
  uint32_t *e_rcode_local;
  uint32_t flags_local;
  DnsStats *this_local;
  
  e_rcode_local._4_4_ = flags;
  if (this->dnssec_packet != (uint8_t *)0x0) {
    e_rcode_local._4_4_ = flags | 0x8000;
  }
  if (e_rcode != (uint32_t *)0x0) {
    *e_rcode = e_rcode_local._4_4_ >> 0x18;
  }
  this->is_using_edns = true;
  this->is_do_flag_set = (e_rcode_local._4_4_ & 0x8000) != 0;
  for (local_24 = 0; local_24 < 0x10; local_24 = local_24 + 1) {
    if ((e_rcode_local._4_4_ & 1 << ((byte)local_24 & 0x1f)) != 0) {
      SubmitRegistryNumber(this,10,0xf - local_24);
    }
  }
  SubmitRegistryNumber(this,0xb,e_rcode_local._4_4_ >> 0x10 & 0xff);
  return;
}

Assistant:

void DnsStats::RegisterEdnsUsage(uint32_t flags, uint32_t* e_rcode)
{
    /* Little safety because flags are set differently for some packets */
    if (dnssec_packet != NULL) {
        flags |= (1 << 15);
    }
    /* Process the flags and rcodes */
    if (e_rcode != NULL)
    {
        *e_rcode = (flags >> 24) & 0xFF;
    }

    /* Register that EDNS was used */
    is_using_edns = true;

    /* Register whether the DO bit was set */
    is_do_flag_set = (flags & (1 << 15)) != 0;

    /* Add flags to registration */
    for (int i = 0; i < 16; i++)
    {
        if ((flags & (1 << i)) != 0)
        {
            SubmitRegistryNumber(REGISTRY_EDNS_Header_Flags, 15 - i);
        }
    }

    SubmitRegistryNumber(REGISTRY_EDNS_Version_number, (flags >> 16) & 0xFF);
}